

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configparser.h
# Opt level: O3

void __thiscall phyr::ConfigArgsList::addParam<int>(ConfigArgsList *this,Param<int> *p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<phyr::ParamAbstract> local_20;
  
  local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001a9b98;
  local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)*p;
  std::
  vector<std::shared_ptr<phyr::ParamAbstract>,std::allocator<std::shared_ptr<phyr::ParamAbstract>>>
  ::emplace_back<std::shared_ptr<phyr::ParamAbstract>>
            ((vector<std::shared_ptr<phyr::ParamAbstract>,std::allocator<std::shared_ptr<phyr::ParamAbstract>>>
              *)this,&local_20);
  if (local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<phyr::ParamAbstract,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void addParam(const Param<U>& p) {
        ASSERT(idx < nArgs);
        argList.push_back(std::make_shared<Param<U>>(p.value, p.type));
    }